

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall fasttext::Dictionary::initTableDiscard(Dictionary *this)

{
  long lVar1;
  ulong uVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  
  std::vector<float,_std::allocator<float>_>::resize(&this->pdiscard_,(long)this->size_);
  if (this->size_ != 0) {
    lVar1 = 8;
    uVar2 = 0;
    do {
      dVar5 = (double)((float)*(long *)((long)&(((this->words_).
                                                 super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->word).
                                               _M_dataplus._M_p + lVar1 * 4) / (float)this->ntokens_
                      );
      auVar4._0_8_ = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->t / dVar5;
      auVar4._8_8_ = 0;
      if (auVar4._0_8_ < 0.0) {
        dVar3 = sqrt(auVar4._0_8_);
      }
      else {
        auVar4 = vsqrtsd_avx(auVar4,auVar4);
        dVar3 = auVar4._0_8_;
      }
      (this->pdiscard_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[uVar2] =
           (float)(dVar3 + ((this->args_).
                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           t / dVar5);
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x36;
    } while (uVar2 < (ulong)(long)this->size_);
  }
  return;
}

Assistant:

void Dictionary::initTableDiscard() {
  pdiscard_.resize(size_);
  for (size_t i = 0; i < size_; i++) {
    real f = real(words_[i].count) / real(ntokens_);
    pdiscard_[i] = sqrt(args_->t / f) + args_->t / f;
  }
}